

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

KLVPacket * __thiscall
ASDCP::KLVPacket::WriteKLToBuffer(KLVPacket *this,FrameBuffer *Buffer,UL *label,ui32_t length)

{
  uint uVar1;
  ui32_t uVar2;
  ui32_t uVar3;
  ILogSink *this_00;
  byte_t *pbVar4;
  byte_t *__src;
  ulong uVar5;
  undefined4 in_register_0000000c;
  Identifier<16U> *this_01;
  uint in_R8D;
  ui32_t length_local;
  UL *label_local;
  FrameBuffer *Buffer_local;
  KLVPacket *this_local;
  
  this_01 = (Identifier<16U> *)CONCAT44(in_register_0000000c,length);
  uVar1 = (*(this_01->super_IArchive)._vptr_IArchive[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("label.HasValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                  ,0x8e,
                  "virtual ASDCP::Result_t ASDCP::KLVPacket::WriteKLToBuffer(ASDCP::FrameBuffer &, const UL &, ui32_t)"
                 );
  }
  uVar2 = FrameBuffer::Size((FrameBuffer *)label);
  uVar3 = FrameBuffer::Capacity((FrameBuffer *)label);
  if (uVar3 < uVar2 + 0x14) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Small write buffer\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    pbVar4 = FrameBuffer::Data((FrameBuffer *)label);
    uVar2 = FrameBuffer::Size((FrameBuffer *)label);
    __src = Kumu::Identifier<16U>::Value(this_01);
    uVar3 = Kumu::Identifier<16U>::Size(this_01);
    memcpy(pbVar4 + uVar2,__src,(ulong)uVar3);
    pbVar4 = FrameBuffer::Data((FrameBuffer *)label);
    uVar2 = FrameBuffer::Size((FrameBuffer *)label);
    uVar5 = Kumu::write_BER(pbVar4 + (ulong)uVar2 + 0x10,(ulong)in_R8D,4);
    if ((uVar5 & 1) == 0) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
    }
    else {
      uVar2 = FrameBuffer::Size((FrameBuffer *)label);
      FrameBuffer::Size((FrameBuffer *)label,uVar2 + 0x14);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVPacket::WriteKLToBuffer(ASDCP::FrameBuffer& Buffer, const UL& label, ui32_t length)
{
  assert(label.HasValue());

  if ( Buffer.Size() + kl_length > Buffer.Capacity() )
    {
      DefaultLogSink().Error("Small write buffer\n");
      return RESULT_FAIL;
    }
  
  memcpy(Buffer.Data() + Buffer.Size(), label.Value(), label.Size());

  if ( ! Kumu::write_BER(Buffer.Data() + Buffer.Size() + SMPTE_UL_LENGTH, length, MXF_BER_LENGTH) )
    return RESULT_FAIL;

  Buffer.Size(Buffer.Size() + kl_length);
  return RESULT_OK;
}